

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O1

void balancePairs(QVector<Delimiter> *delims)

{
  Delimiter *pDVar1;
  Delimiter *pDVar2;
  int iVar3;
  reference pDVar4;
  uint uVar5;
  int iVar6;
  long i;
  ulong i_00;
  bool bVar7;
  
  if (0 < (delims->d).size) {
    i = 0;
    do {
      pDVar1 = (delims->d).ptr;
      if (pDVar1[i].close == true) {
        iVar6 = (int)i;
        uVar5 = ~pDVar1[i].jump + iVar6;
        do {
          if ((int)uVar5 < 0) break;
          i_00 = (ulong)uVar5;
          pDVar2 = (delims->d).ptr;
          if (((pDVar2[i_00].open == true) && (pDVar2[i_00].marker == pDVar1[i].marker)) &&
             (pDVar2[i_00].end < 0)) {
            if (((pDVar2[i_00].close == false) && (pDVar1[i].open != true)) ||
               ((pDVar2[i_00].len == -1 || (pDVar1[i].len == -1)))) {
              bVar7 = false;
            }
            else {
              bVar7 = (pDVar1[i].len + pDVar2[i_00].len) * -0x55555555 + 0x2aaaaaaaU < 0x55555555;
            }
            if (bVar7) goto LAB_00127fc6;
            pDVar4 = QList<Delimiter>::operator[](delims,i);
            pDVar4->jump = iVar6 - uVar5;
            pDVar4 = QList<Delimiter>::operator[](delims,i);
            pDVar4->open = false;
            pDVar4 = QList<Delimiter>::operator[](delims,i_00);
            pDVar4->end = iVar6;
            pDVar4 = QList<Delimiter>::operator[](delims,i_00);
            pDVar4->jump = 0;
            iVar3 = 6;
          }
          else {
LAB_00127fc6:
            uVar5 = uVar5 + ~pDVar2[i_00].jump;
            iVar3 = 0;
          }
        } while (iVar3 == 0);
      }
      i = i + 1;
    } while (i < (delims->d).size);
  }
  return;
}

Assistant:

void balancePairs(QVector<Delimiter> &delims) {
    for (int i = 0; i < delims.length(); ++i) {
        const auto &lastDelim = delims.at(i);

        if (!lastDelim.close) continue;

        int j = i - lastDelim.jump - 1;

        while (j >= 0) {
            const auto &curDelim = delims.at(j);
            if (curDelim.open && curDelim.marker == lastDelim.marker &&
                curDelim.end < 0) {
                const bool oddMatch = (curDelim.close || lastDelim.open) &&
                                      curDelim.len != -1 &&
                                      lastDelim.len != -1 &&
                                      (curDelim.len + lastDelim.len) % 3 == 0;
                if (!oddMatch) {
                    delims[i].jump = i - j;
                    delims[i].open = false;
                    delims[j].end = i;
                    delims[j].jump = 0;
                    break;
                }
            }
            j -= curDelim.jump + 1;
        }
    }
}